

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O0

int graphicMode(void)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  
  if (tinyfd_forceConsole != 0) {
    iVar1 = isTerminalRunning();
    bVar3 = false;
    if (iVar1 != 0) goto LAB_001c73e6;
    pcVar2 = terminalName();
    bVar3 = false;
    if (pcVar2 != (char *)0x0) goto LAB_001c73e6;
  }
  iVar1 = getenvDISPLAY();
  bVar3 = true;
  if (iVar1 == 0) {
    iVar1 = tfd_isDarwin();
    bVar3 = false;
    if (iVar1 != 0) {
      pcVar2 = getenv("SSH_TTY");
      bVar3 = true;
      if (pcVar2 != (char *)0x0) {
        iVar1 = getenvDISPLAY();
        bVar3 = iVar1 != 0;
      }
    }
  }
LAB_001c73e6:
  return (int)bVar3;
}

Assistant:

static int graphicMode(void)
{
        return !( tinyfd_forceConsole && (isTerminalRunning() || terminalName()) )
			&& ( getenvDISPLAY()
			|| (tfd_isDarwin() && (!getenv("SSH_TTY") || getenvDISPLAY() ) ) ) ;
}